

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O1

bool jpge::compress_image_to_jpeg_file
               (char *pFilename,int width,int height,int num_channels,uint8 *pImage_data,
               params *comp_params)

{
  bool bVar1;
  int iVar2;
  byte bVar3;
  undefined1 uVar4;
  ulong uVar5;
  cfile_stream dst_stream;
  jpeg_encoder dst_image;
  cfile_stream local_3518;
  int local_34fc;
  ulong local_34f8;
  ulong local_34f0;
  jpeg_encoder local_34e8;
  
  local_3518.super_output_stream._vptr_output_stream = (_func_int **)&PTR__cfile_stream_001ce780;
  local_3518.m_pFile = (FILE *)0x0;
  local_3518.m_bStatus = false;
  iVar2 = cfile_stream::open(&local_3518,pFilename,height);
  if ((char)iVar2 == '\0') {
    uVar4 = 0;
  }
  else {
    jpeg_encoder::jpeg_encoder(&local_34e8);
    iVar2 = jpeg_encoder::init(&local_34e8,(EVP_PKEY_CTX *)&local_3518);
    uVar5 = 0;
    if ((char)iVar2 != '\0') {
      local_34f8 = (ulong)(uint)height;
      bVar3 = 1;
      local_34fc = height;
      do {
        local_34f0 = uVar5;
        if (0 < local_34fc) {
          iVar2 = 0;
          uVar5 = local_34f8;
          do {
            bVar1 = jpeg_encoder::process_scanline(&local_34e8,pImage_data + iVar2);
            if (!bVar1) goto LAB_00156899;
            iVar2 = iVar2 + num_channels * width;
            uVar5 = uVar5 - 1;
          } while (uVar5 != 0);
        }
        if ((byte)(local_34e8.m_pass_num - 3) < 0xfe) {
LAB_00156899:
          if (bVar3 != 0) {
            uVar5 = 0;
            goto LAB_001568f8;
          }
          break;
        }
        if (local_34e8.m_all_stream_writes_succeeded == true) {
          jpeg_encoder::process_end_of_image(&local_34e8);
        }
        if (local_34e8.m_all_stream_writes_succeeded == false) goto LAB_00156899;
        bVar3 = (int)local_34f0 == 0 & local_34e8.m_params.m_two_pass_flag;
        uVar5 = (ulong)((int)local_34f0 + 1);
      } while (bVar3 == 1);
      free(local_34e8.m_mcu_lines[0]);
      local_34e8.m_mcu_lines[0] = (uint8 *)0x0;
      local_34e8.m_pass_num = '\0';
      local_34e8.m_all_stream_writes_succeeded = true;
      if ((FILE *)local_3518.m_pFile != (FILE *)0x0) {
        iVar2 = fclose((FILE *)local_3518.m_pFile);
        if (iVar2 == -1) {
          local_3518.m_bStatus = false;
        }
        local_3518.m_pFile = (FILE *)0x0;
      }
      uVar5 = (ulong)local_3518.m_bStatus;
    }
LAB_001568f8:
    uVar4 = (undefined1)uVar5;
    jpeg_encoder::~jpeg_encoder(&local_34e8);
  }
  local_3518.super_output_stream._vptr_output_stream = (_func_int **)&PTR__cfile_stream_001ce780;
  if ((FILE *)local_3518.m_pFile != (FILE *)0x0) {
    fclose((FILE *)local_3518.m_pFile);
  }
  return (bool)uVar4;
}

Assistant:

bool compress_image_to_jpeg_file(const char* pFilename, int width, int height, int num_channels, const uint8* pImage_data, const params& comp_params)
	{
		cfile_stream dst_stream;
		if (!dst_stream.open(pFilename))
			return false;

		jpge::jpeg_encoder dst_image;
		if (!dst_image.init(&dst_stream, width, height, num_channels, comp_params))
			return false;

		for (uint pass_index = 0; pass_index < dst_image.get_total_passes(); pass_index++)
		{
			for (int i = 0; i < height; i++)
			{
				const uint8* pBuf = pImage_data + i * width * num_channels;
				if (!dst_image.process_scanline(pBuf))
					return false;
			}
			if (!dst_image.process_scanline(NULL))
				return false;
		}

		dst_image.deinit();

		return dst_stream.close();
	}